

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O0

void finalize_sym_filter(int wiener_win,int32_t *f,int16_t *fi)

{
  int16_t iVar1;
  long lVar2;
  int64_t divisor;
  int64_t dividend;
  int wiener_halfwin;
  int i;
  int16_t *fi_local;
  int32_t *f_local;
  int wiener_win_local;
  
  for (i = 0; i < wiener_win >> 1; i = i + 1) {
    lVar2 = (long)f[i] * 0x80;
    if (lVar2 < 0) {
      fi[i] = (int16_t)((lVar2 + -0x8000) / 0x10000);
    }
    else {
      fi[i] = (int16_t)((lVar2 + 0x8000) / 0x10000);
    }
  }
  if (wiener_win == 7) {
    if (*fi < -5) {
      iVar1 = -5;
    }
    else if (*fi < 0xb) {
      iVar1 = *fi;
    }
    else {
      iVar1 = 10;
    }
    *fi = iVar1;
    if (fi[1] < -0x17) {
      iVar1 = -0x17;
    }
    else if (fi[1] < 9) {
      iVar1 = fi[1];
    }
    else {
      iVar1 = 8;
    }
    fi[1] = iVar1;
    if (fi[2] < -0x11) {
      iVar1 = -0x11;
    }
    else if (fi[2] < 0x2f) {
      iVar1 = fi[2];
    }
    else {
      iVar1 = 0x2e;
    }
    fi[2] = iVar1;
  }
  else {
    if (fi[1] < -0x11) {
      iVar1 = -0x11;
    }
    else if (fi[1] < 0x2f) {
      iVar1 = fi[1];
    }
    else {
      iVar1 = 0x2e;
    }
    fi[2] = iVar1;
    if (*fi < -0x17) {
      iVar1 = -0x17;
    }
    else if (*fi < 9) {
      iVar1 = *fi;
    }
    else {
      iVar1 = 8;
    }
    fi[1] = iVar1;
    *fi = 0;
  }
  fi[6] = *fi;
  fi[5] = fi[1];
  fi[4] = fi[2];
  fi[3] = (*fi + fi[1] + fi[2]) * -2;
  return;
}

Assistant:

static inline void finalize_sym_filter(int wiener_win, int32_t *f,
                                       InterpKernel fi) {
  int i;
  const int wiener_halfwin = (wiener_win >> 1);

  for (i = 0; i < wiener_halfwin; ++i) {
    const int64_t dividend = (int64_t)f[i] * WIENER_FILT_STEP;
    const int64_t divisor = WIENER_TAP_SCALE_FACTOR;
    // Perform this division with proper rounding rather than truncation
    if (dividend < 0) {
      fi[i] = (int16_t)((dividend - (divisor / 2)) / divisor);
    } else {
      fi[i] = (int16_t)((dividend + (divisor / 2)) / divisor);
    }
  }
  // Specialize for 7-tap filter
  if (wiener_win == WIENER_WIN) {
    fi[0] = CLIP(fi[0], WIENER_FILT_TAP0_MINV, WIENER_FILT_TAP0_MAXV);
    fi[1] = CLIP(fi[1], WIENER_FILT_TAP1_MINV, WIENER_FILT_TAP1_MAXV);
    fi[2] = CLIP(fi[2], WIENER_FILT_TAP2_MINV, WIENER_FILT_TAP2_MAXV);
  } else {
    fi[2] = CLIP(fi[1], WIENER_FILT_TAP2_MINV, WIENER_FILT_TAP2_MAXV);
    fi[1] = CLIP(fi[0], WIENER_FILT_TAP1_MINV, WIENER_FILT_TAP1_MAXV);
    fi[0] = 0;
  }
  // Satisfy filter constraints
  fi[WIENER_WIN - 1] = fi[0];
  fi[WIENER_WIN - 2] = fi[1];
  fi[WIENER_WIN - 3] = fi[2];
  // The central element has an implicit +WIENER_FILT_STEP
  fi[3] = -2 * (fi[0] + fi[1] + fi[2]);
}